

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O0

void d_string_append_c(DString *baseString,char appendedCharacter)

{
  size_t newSizeNeeded;
  char appendedCharacter_local;
  DString *baseString_local;
  
  if ((baseString != (DString *)0x0) && (appendedCharacter != '\0')) {
    ensureStringBufferCanHold(baseString,baseString->currentStringLength + 1);
    baseString->str[baseString->currentStringLength] = appendedCharacter;
    baseString->currentStringLength = baseString->currentStringLength + 1;
    baseString->str[baseString->currentStringLength] = '\0';
  }
  return;
}

Assistant:

void d_string_append_c(DString * baseString, char appendedCharacter) {
	if (baseString && appendedCharacter) {
		size_t newSizeNeeded = baseString->currentStringLength + 1;
		ensureStringBufferCanHold(baseString, newSizeNeeded);

		baseString->str[baseString->currentStringLength] = appendedCharacter;
		baseString->currentStringLength++;
		baseString->str[baseString->currentStringLength] = '\0';
	}
}